

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_TIMED_DEC(effect_handler_context_t_conflict *context)

{
  byte local_25;
  wchar_t local_24;
  wchar_t local_14;
  wchar_t amount;
  effect_handler_context_t_conflict *context_local;
  
  local_14 = effect_calculate_value(context,false);
  if (context->other != 0) {
    local_14 = (int)player->timed[context->subtype] / context->other;
  }
  if (local_14 < L'\0') {
    local_24 = L'\0';
  }
  else {
    local_24 = local_14;
  }
  local_25 = 1;
  if ((context->origin).what == SRC_PLAYER) {
    local_25 = context->aware ^ 0xff;
  }
  player_dec_timed(player,context->subtype,local_24,true,(_Bool)(local_25 & 1));
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_TIMED_DEC(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	if (context->other)
		amount = player->timed[context->subtype] / context->other;
	(void) player_dec_timed(player, context->subtype, MAX(amount, 0), true,
		context->origin.what != SRC_PLAYER || !context->aware);
	context->ident = true;
	return true;
}